

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_bf16_t ggml_fp32_to_bf16(float x)

{
  if (0x7f800000 < (uint)ABS(x)) {
    return (ggml_bf16_t)((ushort)((uint)x >> 0x10) | 0x40);
  }
  return (ggml_bf16_t)(uint16_t)(((uint)x >> 0x10 & 1) + (int)x + 0x7fff >> 0x10);
}

Assistant:

ggml_bf16_t ggml_fp32_to_bf16(float x) {
#define ggml_fp32_to_bf16 do_not_use__ggml_fp32_to_bf16__in_ggml
    return GGML_FP32_TO_BF16(x);
}